

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int ParseInt(char *s,int low,int high,int *result)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  undefined4 in_register_00000014;
  
  lVar3 = 0;
  iVar4 = 0;
  do {
    cVar1 = s[lVar3];
    if (cVar1 == '\0') {
      if ((int)lVar3 != 1) {
        if ((int)lVar3 != 0) goto LAB_00103f91;
        goto LAB_00103f98;
      }
      uVar2 = 1;
      goto LAB_00103f9b;
    }
    if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_00103f96;
    iVar4 = (uint)(byte)(cVar1 - 0x30) + iVar4 * 10;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 5;
LAB_00103f91:
  uVar2 = (uint)lVar3;
  if (*s == '0') {
LAB_00103f96:
    lVar3 = 0;
  }
  else {
LAB_00103f9b:
    lVar3 = 0;
    if ((s[uVar2] == '\0') && (iVar4 <= low && -1 < iVar4)) {
      *(int *)CONCAT44(in_register_00000014,high) = iVar4;
      return 1;
    }
  }
LAB_00103f98:
  return (int)lVar3;
}

Assistant:

static BROTLI_BOOL ParseInt(const char* s, int low, int high, int* result) {
  int value = 0;
  int i;
  for (i = 0; i < 5; ++i) {
    char c = s[i];
    if (c == 0) break;
    if (s[i] < '0' || s[i] > '9') return BROTLI_FALSE;
    value = (10 * value) + (c - '0');
  }
  if (i == 0) return BROTLI_FALSE;
  if (i > 1 && s[0] == '0') return BROTLI_FALSE;
  if (s[i] != 0) return BROTLI_FALSE;
  if (value < low || value > high) return BROTLI_FALSE;
  *result = value;
  return BROTLI_TRUE;
}